

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.hpp
# Opt level: O1

SPIRVShaderStageInputAttribs * __thiscall
Diligent::SPIRVShaderResources::GetShaderStageInputAttribs(SPIRVShaderResources *this,Uint32 n)

{
  unsigned_short *in_R9;
  string msg;
  Uint32 local_2c;
  string local_28;
  
  local_2c = n;
  if (this->m_NumShaderStageInputs <= n) {
    FormatString<char[27],unsigned_int,char[39],unsigned_short>
              (&local_28,(Diligent *)"Shader stage input index (",(char (*) [27])&local_2c,
               (uint *)") is out of range. Total input count: ",
               (char (*) [39])&this->m_NumShaderStageInputs,in_R9);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderStageInputAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/SPIRVShaderResources.hpp"
               ,0xc4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  }
  return (SPIRVShaderStageInputAttribs *)
         ((long)(this->m_MemoryBuffer)._M_t.
                super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                ._M_t.
                super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                .super__Head_base<0UL,_void_*,_false>._M_head_impl +
         (ulong)local_2c * 0x10 + (ulong)this->m_TotalResources * 0x20);
}

Assistant:

const SPIRVShaderStageInputAttribs& GetShaderStageInputAttribs(Uint32 n) const noexcept
    {
        VERIFY(n < m_NumShaderStageInputs, "Shader stage input index (", n, ") is out of range. Total input count: ", m_NumShaderStageInputs);
        auto* ResourceMemoryEnd = reinterpret_cast<const SPIRVShaderResourceAttribs*>(m_MemoryBuffer.get()) + m_TotalResources;
        return reinterpret_cast<const SPIRVShaderStageInputAttribs*>(ResourceMemoryEnd)[n];
    }